

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayIndexStaticEnumerator.h
# Opt level: O0

bool __thiscall
Js::ES5ArrayIndexStaticEnumerator<true>::MoveNext
          (ES5ArrayIndexStaticEnumerator<true> *this,PropertyAttributes *attributes)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  BOOL BVar5;
  uint *puVar6;
  undefined4 *puVar7;
  PropertyAttributes *attributes_local;
  ES5ArrayIndexStaticEnumerator<true> *this_local;
  
  uVar1 = this->m_index;
  puVar6 = min<unsigned_int>(&this->m_dataIndex,&this->m_descriptorIndex);
  if (uVar1 != *puVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/ES5ArrayIndexStaticEnumerator.h"
                                ,0x3e,"(m_index == min(m_dataIndex, m_descriptorIndex))",
                                "m_index == min(m_dataIndex, m_descriptorIndex)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (this->m_index == this->m_dataIndex) {
    uVar4 = Js::JavascriptArray::GetNextIndex
                      (&this->m_array->super_JavascriptArray,this->m_dataIndex);
    this->m_dataIndex = uVar4;
  }
  if ((this->m_index == this->m_descriptorIndex) ||
     (BVar5 = ES5Array::IsValidDescriptorToken(this->m_array,this->m_descriptorValidationToken),
     BVar5 == 0)) {
    uVar4 = ES5Array::GetNextDescriptor
                      (this->m_array,this->m_index,&this->m_descriptor,
                       &this->m_descriptorValidationToken);
    this->m_descriptorIndex = uVar4;
  }
  puVar6 = min<unsigned_int>(&this->m_dataIndex,&this->m_descriptorIndex);
  this->m_index = *puVar6;
  if (this->m_index < this->m_initialLength) {
    if (attributes != (PropertyAttributes *)0x0) {
      if (this->m_index < this->m_descriptorIndex) {
        *attributes = '\x01';
      }
      else {
        *attributes = this->m_descriptor->Attributes;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MoveNext(PropertyAttributes* attributes = nullptr)
        {
            while (true)
            {
                Assert(m_index == min(m_dataIndex, m_descriptorIndex));
                if (m_index == m_dataIndex)
                {
                    m_dataIndex = m_array->GetNextIndex(m_dataIndex);
                }
                if (m_index == m_descriptorIndex || !m_array->IsValidDescriptorToken(m_descriptorValidationToken))
                {
                    m_descriptorIndex = m_array->GetNextDescriptor(m_index, &m_descriptor, &m_descriptorValidationToken);
                }

                m_index = min(m_dataIndex, m_descriptorIndex);
                if (m_index >= m_initialLength) // End of array
                {
                    break;
                }

                if (enumNonEnumerable
                    || m_index < m_descriptorIndex
                    || (m_descriptor->Attributes & PropertyEnumerable))
                {
                    if (attributes != nullptr)
                    {
                        if (m_index < m_descriptorIndex)
                        {
                            *attributes = PropertyEnumerable;
                        }
                        else
                        {
                            *attributes = m_descriptor->Attributes;
                        }
                    }

                    return true;
                }
            }

            return false;
        }